

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,ON_Xform *xform)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  int iVar9;
  undefined7 extraout_var;
  double *pdVar10;
  long lVar11;
  ON_Xform *pOVar12;
  byte bVar13;
  double dVar14;
  double dVar15;
  ON_Quaternion local_58;
  double local_30;
  double local_28;
  double dStack_20;
  
  bVar13 = 0;
  local_58.a = this->a;
  local_58.b = this->b;
  local_58.c = this->c;
  local_58.d = this->d;
  bVar8 = Unitize(&local_58);
  if (bVar8) {
    if ((((ABS(local_58.a - this->a) <= 2.3283064365386963e-10) &&
         (ABS(local_58.b - this->b) <= 2.3283064365386963e-10)) &&
        (ABS(local_58.c - this->c) <= 2.3283064365386963e-10)) &&
       (ABS(local_58.d - this->d) <= 2.3283064365386963e-10)) {
      local_58.a = this->a;
      local_58.b = this->b;
      local_58.c = this->c;
      local_58.d = this->d;
    }
    dVar5 = local_58.b;
    dVar4 = local_58.a;
    pdVar10 = ON_Xform::operator[](xform,1);
    dVar7 = local_58.d;
    dVar6 = local_58.c;
    local_28 = local_58.c * dVar4;
    dStack_20 = local_58.d;
    dVar14 = dVar4 * local_58.d;
    dVar15 = dVar5 * local_58.c;
    dVar2 = dVar15 + dVar14;
    *pdVar10 = dVar2 + dVar2;
    dVar3 = dVar5 * local_58.d;
    local_30 = dVar3 - local_28;
    local_30 = local_30 + local_30;
    pdVar10 = ON_Xform::operator[](xform,2);
    *pdVar10 = local_30;
    pdVar10 = ON_Xform::operator[](xform,3);
    *pdVar10 = 0.0;
    dVar15 = dVar15 - dVar14;
    pdVar10 = ON_Xform::operator[](xform,0);
    pdVar10[1] = dVar15 + dVar15;
    dVar2 = dVar7 * dVar6 + dVar5 * dVar4;
    pdVar10 = ON_Xform::operator[](xform,2);
    pdVar10[1] = dVar2 + dVar2;
    pdVar10 = ON_Xform::operator[](xform,3);
    pdVar10[1] = 0.0;
    dVar3 = dVar3 + local_28;
    pdVar10 = ON_Xform::operator[](xform,0);
    pdVar10[2] = dVar3 + dVar3;
    dVar2 = dVar7 * dVar6 - dVar5 * dVar4;
    pdVar10 = ON_Xform::operator[](xform,1);
    pdVar10[2] = dVar2 + dVar2;
    pdVar10 = ON_Xform::operator[](xform,3);
    pdVar10[2] = 0.0;
    dVar2 = dVar6 * dVar6 + dVar7 * dVar7;
    pdVar10 = ON_Xform::operator[](xform,0);
    *pdVar10 = 1.0 - (dVar2 + dVar2);
    dVar2 = dVar7 * dVar7 + dVar5 * dVar5;
    pdVar10 = ON_Xform::operator[](xform,1);
    pdVar10[1] = 1.0 - (dVar2 + dVar2);
    dVar2 = dVar6 * dVar6 + dVar5 * dVar5;
    pdVar10 = ON_Xform::operator[](xform,2);
    pdVar10[2] = 1.0 - (dVar2 + dVar2);
    pdVar10 = ON_Xform::operator[](xform,2);
    pdVar10[3] = 0.0;
    pdVar10 = ON_Xform::operator[](xform,1);
    pdVar10[3] = 0.0;
    pdVar10 = ON_Xform::operator[](xform,0);
    pdVar10[3] = 0.0;
    pdVar10 = ON_Xform::operator[](xform,3);
    pdVar10[3] = 1.0;
  }
  else {
    auVar1._4_4_ = -(uint)(this->b != 0.0);
    auVar1._0_4_ = -(uint)(this->a != 0.0);
    auVar1._8_4_ = -(uint)(this->c != 0.0);
    auVar1._12_4_ = -(uint)(this->d != 0.0);
    iVar9 = movmskps((int)CONCAT71(extraout_var,bVar8),auVar1);
    if (iVar9 == 0) {
      pOVar12 = &ON_Xform::Zero4x4;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                 ,0x125,"","ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
      pOVar12 = &ON_Xform::IdentityTransformation;
    }
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      xform->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar13 * -2 + 1) * 8);
      xform = (ON_Xform *)((long)xform + ((ulong)bVar13 * -2 + 1) * 8);
    }
  }
  return bVar8;
}

Assistant:

bool ON_Quaternion::GetRotation(ON_Xform& xform) const
{
  bool rc;
  ON_Quaternion q(*this);
  if ( q.Unitize() )
  {
    if (    fabs(q.a-a) <= ON_ZERO_TOLERANCE
         && fabs(q.b-b) <= ON_ZERO_TOLERANCE
         && fabs(q.c-c) <= ON_ZERO_TOLERANCE
         && fabs(q.d-d) <= ON_ZERO_TOLERANCE
         )
    {
      // "this" was already unitized - don't tweak bits
      q = *this;
    }
    xform[1][0] = 2.0*(q.b*q.c + q.a*q.d);
    xform[2][0] = 2.0*(q.b*q.d - q.a*q.c);
    xform[3][0] = 0.0;

    xform[0][1] = 2.0*(q.b*q.c - q.a*q.d);
    xform[2][1] = 2.0*(q.c*q.d + q.a*q.b);
    xform[3][1] = 0.0;

    xform[0][2] = 2.0*(q.b*q.d + q.a*q.c);
    xform[1][2] = 2.0*(q.c*q.d - q.a*q.b);
    xform[3][2] = 0.0;

    q.b = q.b*q.b;
    q.c = q.c*q.c;
    q.d = q.d*q.d;
    xform[0][0] = 1.0 - 2.0*(q.c + q.d);
    xform[1][1] = 1.0 - 2.0*(q.b + q.d);
    xform[2][2] = 1.0 - 2.0*(q.b + q.c);

    xform[0][3] = xform[1][3] = xform[2][3] = 0.0;
    xform[3][3] = 1.0;
    rc = true;
  }
  else if ( IsZero() )
  {
    xform = ON_Xform::Zero4x4;
    rc = false;
  }
  else
  {
    // something is seriously wrong
    ON_ERROR("ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
    xform = ON_Xform::IdentityTransformation;
    rc = false;
  }

  return rc;
}